

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_wait(ENetSocket socket,uint32_t *condition,uint64_t timeout)

{
  int iVar1;
  int *piVar2;
  ENetSocket local_28;
  int pollCount;
  pollfd pollSocket;
  uint64_t timeout_local;
  uint32_t *condition_local;
  ENetSocket socket_local;
  
  pollCount._0_2_ = 0;
  if ((*condition & 1) != 0) {
    pollCount._0_2_ = 4;
  }
  if ((*condition & 2) != 0) {
    pollCount._0_2_ = (ushort)pollCount | 1;
  }
  local_28 = socket;
  pollSocket = (pollfd)timeout;
  iVar1 = poll((pollfd *)&stack0xffffffffffffffd8,1,(int)timeout);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if ((*piVar2 == 4) && ((*condition & 4) != 0)) {
      *condition = 4;
      condition_local._4_4_ = 0;
    }
    else {
      condition_local._4_4_ = -1;
    }
  }
  else {
    *condition = 0;
    if (iVar1 == 0) {
      condition_local._4_4_ = 0;
    }
    else {
      if ((pollCount._2_2_ & 4) != 0) {
        *condition = *condition | 1;
      }
      if ((pollCount._2_2_ & 1) != 0) {
        *condition = *condition | 2;
      }
      condition_local._4_4_ = 0;
    }
  }
  return condition_local._4_4_;
}

Assistant:

int enet_socket_wait(ENetSocket socket, uint32_t* condition, uint64_t timeout) {
	struct pollfd pollSocket;
	int pollCount;

	pollSocket.fd = socket;
	pollSocket.events = 0;

	if (*condition & ENET_SOCKET_WAIT_SEND)
		pollSocket.events |= POLLOUT;

	if (*condition & ENET_SOCKET_WAIT_RECEIVE)
		pollSocket.events |= POLLIN;

	pollCount = poll(&pollSocket, 1, timeout);

	if (pollCount < 0) {
		if (errno == EINTR && *condition & ENET_SOCKET_WAIT_INTERRUPT) {
			*condition = ENET_SOCKET_WAIT_INTERRUPT;

			return 0;
		}

		ENET_LOG_ERROR("Socket wait: pollCount < 0, %i", pollCount);
		return -1;
	}

	*condition = ENET_SOCKET_WAIT_NONE;

	if (pollCount == 0)
		return 0;

	if (pollSocket.revents & POLLOUT)
		*condition |= ENET_SOCKET_WAIT_SEND;

	if (pollSocket.revents & POLLIN)
		*condition |= ENET_SOCKET_WAIT_RECEIVE;

	return 0;
}